

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomFragmentOpTests.cpp
# Opt level: O0

UVec4 __thiscall
deqp::gles3::Functional::RandomFragmentOpCase::getCompareThreshold(RandomFragmentOpCase *this)

{
  bool bVar1;
  RenderTarget *this_00;
  PixelFormat *pPVar2;
  undefined8 uVar3;
  long in_RSI;
  Vector<unsigned_int,_4> VVar4;
  UVec4 UVar5;
  bool local_d1;
  Vector<unsigned_int,_4> local_d0;
  Vector<unsigned_int,_4> local_c0;
  deUint32 local_b0;
  RGBA local_ac [4];
  Vector<unsigned_int,_4> local_9c;
  Vector<unsigned_int,_4> local_8c;
  Vector<unsigned_int,_4> local_7c;
  deUint32 local_6c;
  RGBA local_68 [4];
  Vector<unsigned_int,_4> local_58;
  PixelFormat local_48;
  PixelFormat local_38;
  undefined1 local_28 [8];
  PixelFormat format;
  RandomFragmentOpCase *this_local;
  
  this_00 = gles3::Context::getRenderTarget(*(Context **)(in_RSI + 0x70));
  pPVar2 = tcu::RenderTarget::getPixelFormat(this_00);
  local_28._0_4_ = pPVar2->redBits;
  local_28._4_4_ = pPVar2->greenBits;
  format.redBits = pPVar2->blueBits;
  format.greenBits = pPVar2->alphaBits;
  tcu::PixelFormat::PixelFormat(&local_38,8,8,8,8);
  bVar1 = tcu::PixelFormat::operator==((PixelFormat *)local_28,&local_38);
  local_d1 = true;
  if (!bVar1) {
    tcu::PixelFormat::PixelFormat(&local_48,8,8,8,0);
    local_d1 = tcu::PixelFormat::operator==((PixelFormat *)local_28,&local_48);
  }
  if (local_d1 == false) {
    local_b0 = (deUint32)tcu::PixelFormat::getColorThreshold((PixelFormat *)local_28);
    tcu::RGBA::toIVec(local_ac);
    tcu::Vector<int,_4>::asUint((Vector<int,_4> *)&local_9c);
    tcu::Vector<unsigned_int,_4>::Vector(&local_c0,5);
    tcu::operator*((tcu *)&local_8c,&local_9c,&local_c0);
    tcu::Vector<unsigned_int,_4>::Vector(&local_d0,2);
    VVar4 = tcu::operator+((tcu *)this,&local_8c,&local_d0);
    uVar3 = VVar4.m_data._8_8_;
  }
  else {
    local_6c = (deUint32)tcu::PixelFormat::getColorThreshold((PixelFormat *)local_28);
    tcu::RGBA::toIVec(local_68);
    tcu::Vector<int,_4>::asUint((Vector<int,_4> *)&local_58);
    tcu::Vector<unsigned_int,_4>::Vector(&local_7c,2);
    VVar4 = tcu::operator+((tcu *)this,&local_58,&local_7c);
    uVar3 = VVar4.m_data._8_8_;
  }
  UVar5.m_data[2] = (int)uVar3;
  UVar5.m_data[3] = (int)((ulong)uVar3 >> 0x20);
  UVar5.m_data._0_8_ = this;
  return (UVec4)UVar5.m_data;
}

Assistant:

tcu::UVec4 RandomFragmentOpCase::getCompareThreshold (void) const
{
	tcu::PixelFormat format = m_context.getRenderTarget().getPixelFormat();

	if (format == tcu::PixelFormat(8, 8, 8, 8) || format == tcu::PixelFormat(8, 8, 8, 0))
		return format.getColorThreshold().toIVec().asUint() + tcu::UVec4(2); // Default threshold.
	else
		return format.getColorThreshold().toIVec().asUint()
			   * tcu::UVec4(5) + tcu::UVec4(2); // \note Non-scientific ad hoc formula. Need big threshold when few color bits; especially multiple blendings bring extra inaccuracy.
}